

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_ls.c
# Opt level: O3

int ARKodeSetLinSysFn(void *arkode_mem,ARKLsLinSysFn linsys)

{
  long lVar1;
  int line;
  int iVar2;
  int error_code;
  char *msgfmt;
  
  if (arkode_mem == (void *)0x0) {
    msgfmt = "arkode_mem = NULL illegal.";
    iVar2 = -0x15;
    arkode_mem = (ARKodeMem)0x0;
    error_code = -0x15;
    line = 0x3f6;
  }
  else if (*(int *)((long)arkode_mem + 0x110) == 0) {
    msgfmt = "time-stepping module does not require an algebraic solver";
    iVar2 = -0x30;
    error_code = -0x30;
    line = 0x3ff;
  }
  else {
    lVar1 = (**(code **)((long)arkode_mem + 0x128))(arkode_mem);
    if (lVar1 != 0) {
      if (linsys == (ARKLsLinSysFn)0x0) {
        *(undefined4 *)(lVar1 + 0x118) = 0;
        *(code **)(lVar1 + 0x120) = arkLsLinSys;
        *(void **)(lVar1 + 0x128) = arkode_mem;
      }
      else {
        if (*(long *)(lVar1 + 0x40) == 0) {
          msgfmt = "Linear system setup routine cannot be supplied for NULL SUNMatrix";
          iVar2 = -3;
          error_code = -3;
          line = 0x40b;
          goto LAB_0013c137;
        }
        *(undefined4 *)(lVar1 + 0x118) = 1;
        *(ARKLsLinSysFn *)(lVar1 + 0x120) = linsys;
        *(undefined8 *)(lVar1 + 0x128) = *(undefined8 *)((long)arkode_mem + 0x10);
      }
      return 0;
    }
    msgfmt = "Linear solver memory is NULL.";
    iVar2 = -2;
    error_code = -2;
    line = 0xfc4;
  }
LAB_0013c137:
  arkProcessError((ARKodeMem)arkode_mem,error_code,line,"ARKodeSetLinSysFn",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_ls.c"
                  ,msgfmt);
  return iVar2;
}

Assistant:

int ARKodeSetLinSysFn(void* arkode_mem, ARKLsLinSysFn linsys)
{
  ARKodeMem ark_mem;
  ARKLsMem arkls_mem;
  int retval;

  /* Return immediately if arkode_mem is NULL */
  if (arkode_mem == NULL)
  {
    arkProcessError(NULL, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ARK_NO_MEM);
    return (ARK_MEM_NULL);
  }
  ark_mem = (ARKodeMem)arkode_mem;

  /* Guard against use for time steppers that do not need an algebraic solver */
  if (!ark_mem->step_supports_implicit)
  {
    arkProcessError(ark_mem, ARK_STEPPER_UNSUPPORTED, __LINE__, __func__,
                    __FILE__, "time-stepping module does not require an algebraic solver");
    return (ARK_STEPPER_UNSUPPORTED);
  }

  /* access ARKLsMem structure */
  retval = arkLs_AccessLMem(ark_mem, __func__, &arkls_mem);
  if (retval != ARKLS_SUCCESS) { return (retval); }

  /* return with failure if linsys cannot be used */
  if ((linsys != NULL) && (arkls_mem->A == NULL))
  {
    arkProcessError(ark_mem, ARKLS_ILL_INPUT, __LINE__, __func__,
                    __FILE__, "Linear system setup routine cannot be supplied for NULL SUNMatrix");
    return (ARKLS_ILL_INPUT);
  }

  /* set the linear system routine pointer, and update relevant flags */
  if (linsys != NULL)
  {
    arkls_mem->user_linsys = SUNTRUE;
    arkls_mem->linsys      = linsys;
    arkls_mem->A_data      = ark_mem->user_data;
  }
  else
  {
    arkls_mem->user_linsys = SUNFALSE;
    arkls_mem->linsys      = arkLsLinSys;
    arkls_mem->A_data      = ark_mem;
  }

  return (ARKLS_SUCCESS);
}